

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O3

XXH64_hash_t
XXH3_hashLong_64b_withSeed(void *input,size_t len,XXH64_hash_t seed,xxh_u8 *secret,size_t secretLen)

{
  long lVar1;
  XXH64_hash_t XVar2;
  long lVar3;
  xxh_u8 *secret_00;
  XXH3_f_accumulate_512 in_R9;
  xxh_u64 *acc_00;
  xxh_u64 acc [8];
  xxh_u64 acc_1 [8];
  XXH3_f_scrambleAcc in_stack_fffffffffffffee8;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  xxh_u64 local_58 [8];
  
  acc_00 = (xxh_u64 *)&stack0xfffffffffffffee8;
  if (seed == 0) {
    local_e8 = 0x27d4eb2f165667c5;
    uStack_e0 = 0x9e3779b1;
    local_f8 = 0x85ebca77c2b2ae63;
    uStack_f0 = 0x85ebca77;
    local_108 = 0xc2b2ae3d27d4eb4f;
    uStack_100 = 0x165667b19e3779f9;
    uStack_110 = 0x9e3779b185ebca87;
    XXH3_hashLong_internal_loop
              ((xxh_u64 *)&stack0xfffffffffffffee8,(xxh_u8 *)input,len,XXH3_kSecret,0xc0,in_R9,
               (XXH3_f_scrambleAcc)0xc2b2ae3d);
    secret_00 = XXH3_kSecret + 0xb;
  }
  else {
    lVar3 = 0;
    do {
      lVar1 = *(long *)(XXH3_kSecret + lVar3 + 8);
      *(XXH64_hash_t *)(&stack0xfffffffffffffee8 + lVar3) = *(long *)(XXH3_kSecret + lVar3) + seed;
      *(XXH64_hash_t *)((long)&uStack_110 + lVar3) = lVar1 - seed;
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0xc0);
    acc_00 = local_58;
    local_58[6] = 0x27d4eb2f165667c5;
    local_58[7] = 0x9e3779b1;
    local_58[4] = 0x85ebca77c2b2ae63;
    local_58[5] = 0x85ebca77;
    local_58[2] = 0xc2b2ae3d27d4eb4f;
    local_58[3] = 0x165667b19e3779f9;
    local_58[0] = 0xc2b2ae3d;
    local_58[1] = 0x9e3779b185ebca87;
    XXH3_hashLong_internal_loop
              (acc_00,(xxh_u8 *)input,len,&stack0xfffffffffffffee8,0xc0,in_R9,
               in_stack_fffffffffffffee8);
    secret_00 = (xxh_u8 *)((long)&uStack_110 + 3);
  }
  XVar2 = XXH3_mergeAccs(acc_00,secret_00,len * -0x61c8864e7a143579);
  return XVar2;
}

Assistant:

XXH_NO_INLINE XXH64_hash_t XXH3_hashLong_64b_withSeed(const void* input,
                                                      size_t len,
                                                      XXH64_hash_t seed,
                                                      const xxh_u8* secret,
                                                      size_t secretLen) {
  (void)secret;
  (void)secretLen;
  return XXH3_hashLong_64b_withSeed_internal(
      input, len, seed, XXH3_accumulate_512, XXH3_scrambleAcc,
      XXH3_initCustomSecret);
}